

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPFakeTransmitter::ClearDestinations(RTPFakeTransmitter *this)

{
  RTPFakeTransmitter *this_local;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
    ::Clear(&this->destinations);
  }
  return;
}

Assistant:

void RTPFakeTransmitter::ClearDestinations()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
		destinations.Clear();
	MAINMUTEX_UNLOCK
}